

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::grow(DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
       *this,uint AtLeast)

{
  uint uVar1;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsBegin;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = this->NumBuckets;
  OldBucketsBegin = this->Buckets;
  uVar3 = AtLeast - 1 >> 1 | AtLeast - 1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = (uVar3 >> 0x10 | uVar3) + 1;
  uVar4 = 0x40;
  if (0x40 < uVar3) {
    uVar4 = (ulong)uVar3;
  }
  this->NumBuckets = (uint)uVar4;
  pDVar2 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)operator_new(uVar4 << 4);
  this->Buckets = pDVar2;
  if (OldBucketsBegin != (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
    DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                *)this,OldBucketsBegin,OldBucketsBegin + uVar1);
    operator_delete(OldBucketsBegin);
    return;
  }
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  ::initEmpty((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
               *)this);
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    operator delete(OldBuckets);
  }